

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::OffsetPolygons
               (Polygons *in_polys,Polygons *out_polys,double delta,JoinType jointype,
               double MiterLimit)

{
  Polygons poly2;
  vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
  local_110;
  PolyOffsetBuilder local_f8;
  PolyOffsetBuilder local_88;
  
  if (out_polys == in_polys) {
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::vector(&local_110,in_polys);
    PolyOffsetBuilder::PolyOffsetBuilder(&local_f8,&local_110,out_polys,delta,jointype,MiterLimit);
    PolyOffsetBuilder::~PolyOffsetBuilder(&local_f8);
    std::
    vector<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>,_std::allocator<std::vector<ClipperLib::IntPoint,_std::allocator<ClipperLib::IntPoint>_>_>_>
    ::~vector(&local_110);
  }
  else {
    PolyOffsetBuilder::PolyOffsetBuilder(&local_88,in_polys,out_polys,delta,jointype,MiterLimit);
    PolyOffsetBuilder::~PolyOffsetBuilder(&local_88);
  }
  return;
}

Assistant:

void OffsetPolygons(const Polygons &in_polys, Polygons &out_polys,
  double delta, JoinType jointype, double MiterLimit)
{
  if (&out_polys == &in_polys)
  {
    Polygons poly2(in_polys);
    PolyOffsetBuilder(poly2, out_polys, delta, jointype, MiterLimit);
  }
  else PolyOffsetBuilder(in_polys, out_polys, delta, jointype, MiterLimit);
}